

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH32_reset(XXH32_state_t *statePtr,uint seed)

{
  undefined1 local_44 [8];
  XXH32_state_t state;
  uint seed_local;
  XXH32_state_t *statePtr_local;
  
  state.memsize = seed;
  unique0x10000052 = statePtr;
  memset(local_44,0,0x2c);
  state.total_len_32 = state.memsize + 0x24234428;
  state.large_len = state.memsize + 0x85ebca77;
  state.v1 = state.memsize;
  state.v2 = state.memsize + 0x61c8864f;
  memcpy(stack0xfffffffffffffff0,local_44,0x30);
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_reset(XXH32_state_t* statePtr, unsigned int seed)
{
    XXH32_state_t state;   /* using a local state to memcpy() in order to avoid strict-aliasing warnings */
    ZSTD_memset(&state, 0, sizeof(state)-4);   /* do not write into reserved, for future removal */
    state.v1 = seed + PRIME32_1 + PRIME32_2;
    state.v2 = seed + PRIME32_2;
    state.v3 = seed + 0;
    state.v4 = seed - PRIME32_1;
    ZSTD_memcpy(statePtr, &state, sizeof(state));
    return XXH_OK;
}